

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O1

void __thiscall Assimp::XGLImporter::ReadFaceVertex(XGLImporter *this,TempMesh *t,TempFace *out)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  _Rb_tree_color _Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  bool bVar9;
  aiVector2D aVar10;
  aiVector3D aVar11;
  string local_b0;
  _Base_ptr local_90;
  TempMesh *local_88;
  string local_80;
  aiVector3D *local_60;
  _Base_ptr local_58;
  string local_50;
  
  GetElementName_abi_cxx11_(&local_50,this);
  p_Var7 = &(t->uvs)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_58 = &(t->normals)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_60 = &out->normal;
  p_Var8 = &(t->points)._M_t._M_impl.super__Rb_tree_header;
  bVar9 = false;
  local_90 = p_Var7;
  local_88 = t;
  while (bVar2 = ReadElementUpToClosing(this,local_50._M_dataplus._M_p), bVar2) {
    GetElementName_abi_cxx11_(&local_80,this);
    iVar3 = std::__cxx11::string::compare((char *)&local_80);
    if (iVar3 == 0) {
      _Var4 = ReadIndexFromText(this);
      p_Var7 = (local_88->points)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var8->_M_header;
      for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[bVar9]) {
        bVar9 = p_Var7[1]._M_color < _Var4;
        if (!bVar9) {
          p_Var5 = p_Var7;
        }
      }
      p_Var7 = &p_Var8->_M_header;
      if (((_Rb_tree_header *)p_Var5 != p_Var8) && (p_Var7 = p_Var5, _Var4 < p_Var5[1]._M_color)) {
        p_Var7 = &p_Var8->_M_header;
      }
      if ((_Rb_tree_header *)p_Var7 == p_Var8) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"point index out of range","");
        LogFunctions<Assimp::XGLImporter>::ThrowException(&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
      }
      (out->pos).z = *(float *)((long)&p_Var7[1]._M_parent + 4);
      uVar1 = *(undefined8 *)&p_Var7[1].field_0x4;
      (out->pos).x = (float)(int)uVar1;
      (out->pos).y = (float)(int)((ulong)uVar1 >> 0x20);
      bVar9 = true;
      p_Var7 = local_90;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&local_80);
      if (iVar3 == 0) {
        _Var4 = ReadIndexFromText(this);
        p_Var5 = local_58;
        for (p_Var7 = (local_88->normals)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[bVar2]) {
          bVar2 = p_Var7[1]._M_color < _Var4;
          if (!bVar2) {
            p_Var5 = p_Var7;
          }
        }
        p_Var7 = local_58;
        if ((p_Var5 != local_58) && (p_Var7 = p_Var5, _Var4 < p_Var5[1]._M_color)) {
          p_Var7 = local_58;
        }
        if (p_Var7 == local_58) {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"normal index out of range","");
          LogFunctions<Assimp::XGLImporter>::ThrowException(&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
        }
        local_60->z = *(float *)((long)&p_Var7[1]._M_parent + 4);
        uVar1 = *(undefined8 *)&p_Var7[1].field_0x4;
        local_60->x = (float)(int)uVar1;
        local_60->y = (float)(int)((ulong)uVar1 >> 0x20);
        out->has_normal = true;
        p_Var7 = local_90;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_80);
        if (iVar3 == 0) {
          _Var4 = ReadIndexFromText(this);
          p_Var6 = p_Var7;
          for (p_Var5 = (local_88->uvs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[bVar2]) {
            bVar2 = p_Var5[1]._M_color < _Var4;
            if (!bVar2) {
              p_Var6 = p_Var5;
            }
          }
          p_Var5 = p_Var7;
          if ((p_Var6 != p_Var7) && (p_Var5 = p_Var6, _Var4 < p_Var6[1]._M_color)) {
            p_Var5 = p_Var7;
          }
          if (p_Var5 == p_Var7) {
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b0,"uv index out of range","");
            LogFunctions<Assimp::XGLImporter>::ThrowException(&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
          }
          out->uv = *(aiVector2D *)&p_Var5[1].field_0x4;
          out->has_uv = true;
          p_Var7 = local_90;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_80);
          if (iVar3 == 0) {
            aVar11 = ReadVec3(this);
            out->pos = aVar11;
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_80);
            if (iVar3 == 0) {
              aVar11 = ReadVec3(this);
              out->normal = aVar11;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&local_80);
              if (iVar3 == 0) {
                aVar10 = ReadVec2(this);
                out->uv = aVar10;
              }
            }
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  if (!bVar9) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"missing <pref> in <fvN> element","");
    LogFunctions<Assimp::XGLImporter>::ThrowException(&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void XGLImporter::ReadFaceVertex(const TempMesh& t, TempFace& out)
{
    const std::string& end = GetElementName();

    bool havep = false;
    while (ReadElementUpToClosing(end.c_str()))  {
        const std::string& s = GetElementName();
        if (s == "pref") {
            const unsigned int id = ReadIndexFromText();
            std::map<unsigned int, aiVector3D>::const_iterator it = t.points.find(id);
            if (it == t.points.end()) {
                ThrowException("point index out of range");
            }

            out.pos = (*it).second;
            havep = true;
        }
        else if (s == "nref") {
            const unsigned int id = ReadIndexFromText();
            std::map<unsigned int, aiVector3D>::const_iterator it = t.normals.find(id);
            if (it == t.normals.end()) {
                ThrowException("normal index out of range");
            }

            out.normal = (*it).second;
            out.has_normal = true;
        }
        else if (s == "tcref") {
            const unsigned int id = ReadIndexFromText();
            std::map<unsigned int, aiVector2D>::const_iterator it = t.uvs.find(id);
            if (it == t.uvs.end()) {
                ThrowException("uv index out of range");
            }

            out.uv = (*it).second;
            out.has_uv = true;
        }
        else if (s == "p") {
            out.pos = ReadVec3();
        }
        else if (s == "n") {
            out.normal = ReadVec3();
        }
        else if (s == "tc") {
            out.uv = ReadVec2();
        }
    }

    if (!havep) {
        ThrowException("missing <pref> in <fvN> element");
    }
}